

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation_p.h
# Opt level: O2

QVariant *
_q_interpolateVariant<QLine>(QVariant *__return_storage_ptr__,QLine *from,QLine *to,qreal progress)

{
  QLine l;
  
  l = _q_interpolate<QLine>(from,to,progress);
  QVariant::QVariant(__return_storage_ptr__,l);
  return __return_storage_ptr__;
}

Assistant:

inline QVariant _q_interpolateVariant(const T &from, const T &to, qreal progress)
{
    return _q_interpolate(from, to, progress);
}